

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legendre.h
# Opt level: O0

float legendre_total(vec3 *pos,float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float total_scalar;
  float *coefficients_local;
  vec3 *pos_local;
  
  fVar9 = legendre_0_0(pos);
  fVar1 = *coefficients;
  fVar10 = legendre_1_0(pos);
  fVar2 = coefficients[1];
  fVar11 = legendre_1_1(pos);
  fVar3 = coefficients[2];
  fVar12 = legendre_1_2(pos);
  fVar4 = coefficients[3];
  fVar13 = legendre_2_0(pos);
  fVar5 = coefficients[4];
  fVar14 = legendre_2_1(pos);
  fVar6 = coefficients[5];
  fVar15 = legendre_2_2(pos);
  fVar7 = coefficients[6];
  fVar16 = legendre_2_3(pos);
  fVar8 = coefficients[7];
  fVar17 = legendre_2_4(pos);
  return fVar17 * coefficients[8] +
         fVar16 * fVar8 +
         fVar15 * fVar7 +
         fVar14 * fVar6 +
         fVar13 * fVar5 + fVar12 * fVar4 + fVar11 * fVar3 + fVar9 * fVar1 + fVar10 * fVar2;
}

Assistant:

inline float legendre_total(const glm::vec3 &pos, float *coefficients) {
    float total_scalar = legendre_0_0(pos) * coefficients[0] +
                         legendre_1_0(pos) * coefficients[1] +
                         legendre_1_1(pos) * coefficients[2] +
                         legendre_1_2(pos) * coefficients[3] +
                         legendre_2_0(pos) * coefficients[4] +
                         legendre_2_1(pos) * coefficients[5] +
                         legendre_2_2(pos) * coefficients[6] +
                         legendre_2_3(pos) * coefficients[7] +
                         legendre_2_4(pos) * coefficients[8];
    return total_scalar;
}